

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

VkResult shim_vkGetPhysicalDeviceSurfaceSupportKHR
                   (VkPhysicalDevice physicalDevice,uint32_t queueFamilyIndex,VkSurfaceKHR surface,
                   VkBool32 *pSupported)

{
  ulong uVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  
  if ((long)mock.physical_device_handles.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)mock.physical_device_handles.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar2 = (long)mock.physical_device_handles.
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)mock.physical_device_handles.
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    plVar3 = (long *)&(mock.physical_devices_details.
                       super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0x640;
    lVar4 = 0;
    do {
      if ((mock.physical_device_handles.
           super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4] == physicalDevice) &&
         (uVar1 = (*plVar3 - plVar3[-1] >> 3) * -0x5555555555555555,
         uVar1 < queueFamilyIndex || uVar1 - queueFamilyIndex == 0)) {
        return VK_ERROR_FORMAT_NOT_SUPPORTED;
      }
      lVar4 = lVar4 + 1;
      plVar3 = plVar3 + 0xd3;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
  }
  if (pSupported != (VkBool32 *)0x0 && surface != (VkSurfaceKHR)0x0) {
    *pSupported = 1;
  }
  return VK_SUCCESS;
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkGetPhysicalDeviceSurfaceSupportKHR(
    VkPhysicalDevice physicalDevice, uint32_t queueFamilyIndex, VkSurfaceKHR surface, VkBool32* pSupported) {

    for (size_t i = 0; i < mock.physical_device_handles.size(); i++) {
        if (physicalDevice == mock.physical_device_handles[i]) {
            if (queueFamilyIndex >= mock.physical_devices_details[i].queue_family_properties.size()) {
                return VK_ERROR_FORMAT_NOT_SUPPORTED;
            }
        }
    }
    if (surface && pSupported) {
        *pSupported = true;
    }
    return VK_SUCCESS;
}